

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd.c
# Opt level: O1

list MSD1(list a,int n)

{
  long lVar1;
  byte bVar2;
  int pos;
  list plVar3;
  stack *psVar4;
  list plVar5;
  list plVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  list plVar10;
  stack *temp;
  ulong uVar11;
  bucket_conflict1 *b;
  list local_38;
  
  if (1 < n) {
    initmem(stackmem,0x18,(uint)n / 0x32);
    psVar4 = (stack *)allocmem(stackmem,0x18);
    stackp = psVar4;
    psVar4->head = a;
    psVar4->tail = (list)0x0;
    psVar4->size = n;
    psVar4->pos = 0;
    if (stackp == (stack *)0x0) {
      local_38 = (list)0x0;
    }
    else {
      local_38 = (list)0x0;
      do {
        psVar4 = stackp;
        stackp = (stack *)deallocmem(stackmem,0x18);
        if (psVar4->size == 0) {
          psVar4->tail->next = local_38;
          local_38 = psVar4->head;
        }
        else {
          plVar6 = psVar4->head;
          pos = psVar4->pos;
          uVar8 = (uint)plVar6->str[pos];
          plVar10 = plVar6;
          if (plVar6->next == (list)0x0) {
            iVar7 = 1;
            uVar11 = 0;
            uVar9 = 0xff;
          }
          else {
            uVar9 = 0xff;
            uVar11 = 0;
            iVar7 = 1;
            plVar5 = plVar6;
            plVar3 = plVar6->next;
            do {
              plVar6 = plVar3;
              bVar2 = plVar6->str[pos];
              if (uVar8 == bVar2) {
                iVar7 = iVar7 + 1;
              }
              else {
                lVar1 = (ulong)uVar8 * 0x18;
                if ((&bucketing_b)[(ulong)uVar8 * 3] == 0) {
                  (&bucketing_b)[(ulong)uVar8 * 3] = (long)plVar10;
                  *(list *)(&DAT_00c9cc38 + lVar1) = plVar5;
                  *(int *)(&DAT_00c9cc40 + lVar1) = iVar7;
                  if (uVar8 != 0) {
                    if (uVar8 <= uVar9) {
                      uVar9 = uVar8;
                    }
                    if ((uint)uVar11 <= uVar8) {
                      uVar11 = (ulong)uVar8;
                    }
                  }
                }
                else {
                  *(list *)(*(long *)(&DAT_00c9cc38 + lVar1) + 8) = plVar10;
                  *(list *)(&DAT_00c9cc38 + lVar1) = plVar5;
                  *(int *)(&DAT_00c9cc40 + lVar1) = *(int *)(&DAT_00c9cc40 + lVar1) + iVar7;
                }
                iVar7 = 1;
                plVar10 = plVar6;
                uVar8 = (uint)bVar2;
              }
              plVar5 = plVar6;
              plVar3 = plVar6->next;
            } while (plVar6->next != (list)0x0);
          }
          lVar1 = (ulong)uVar8 * 0x18;
          if ((&bucketing_b)[(ulong)uVar8 * 3] == 0) {
            (&bucketing_b)[(ulong)uVar8 * 3] = (long)plVar10;
            *(list *)(&DAT_00c9cc38 + lVar1) = plVar6;
            *(int *)(&DAT_00c9cc40 + lVar1) = iVar7;
            if (uVar8 != 0) {
              if (uVar8 <= uVar9) {
                uVar9 = uVar8;
              }
              if ((uint)uVar11 <= uVar8) {
                uVar11 = (ulong)uVar8;
              }
            }
          }
          else {
            *(list *)(*(long *)(&DAT_00c9cc38 + lVar1) + 8) = plVar10;
            *(list *)(&DAT_00c9cc38 + lVar1) = plVar6;
            *(int *)(&DAT_00c9cc40 + lVar1) = *(int *)(&DAT_00c9cc40 + lVar1) + iVar7;
          }
          if (bucketing_b != 0) {
            _DAT_00c9cc40 = 0;
            ontostack((bucket_conflict1 *)&bucketing_b,pos);
          }
          if (uVar9 <= (uint)uVar11) {
            b = (bucket_conflict1 *)(&bucketing_b + (ulong)uVar9 * 3);
            do {
              if (b->head != (list)0x0) {
                ontostack(b,pos + 1);
              }
              b = b + 1;
            } while (b <= (bucket_conflict1 *)(&bucketing_b + uVar11 * 3));
          }
        }
      } while (stackp != (stack *)0x0);
    }
    freemem(stackmem);
    a = local_38;
  }
  return a;
}

Assistant:

list MSD1(list a, int n)
{
   list res = NULL;
   stack *s;

   if (n < 2) return a;
   initmem(stackmem, sizeof(struct stackrec), n/50);
   push(a, NULL, n, 0);

   while (!stackempty()) {
      s = pop();
      if (!s->size) {   /* sorted */
         s->tail->next = res;
         res = s->head;
         continue;
      }
      bucketing(s->head, s->pos);
   }

   freemem(stackmem);
   return res;
}